

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,ArrayAccessExpression *expression)

{
  int iVar1;
  int index;
  Value *pVVar2;
  ArrayValue *this_00;
  Symbol local_60;
  string local_40;
  
  pVVar2 = TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,
                      &expression->index_expression_->super_Node);
  iVar1 = (*pVVar2->_vptr_Value[2])(pVVar2);
  std::__cxx11::string::string((string *)&local_40,(string *)&expression->array_indent_);
  Symbol::Symbol(&local_60,&local_40);
  index = FunctionTable::Get(&this->table_,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pVVar2 = FrameEmulator::Get(&this->frame_,index);
  this_00 = (ArrayValue *)__dynamic_cast(pVVar2,&Value::typeinfo,&ArrayValue::typeinfo,0);
  pVVar2 = ArrayValue::AtIndex(this_00,(long)iVar1);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar2;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(ArrayAccessExpression* expression) {
  int array_index = Accept(expression->index_expression_)->GetValue();
  int index = table_.Get(Symbol(expression->array_indent_));
  tos_value_ =
      dynamic_cast<ArrayValue*>(frame_.Get(index))->AtIndex(array_index);
}